

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char cVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  undefined4 uVar20;
  ulong unaff_RBP;
  ulong uVar21;
  size_t sVar22;
  NodeRef *pNVar23;
  NodeRef *pNVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar38;
  float fVar41;
  vint4 bi;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar44;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar39;
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar45;
  float fVar46;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar47;
  float fVar48;
  float fVar55;
  float fVar57;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar59;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  float fVar58;
  float fVar60;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar81;
  float fVar82;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar83;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  vint4 ai_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 ai;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vint4 ai_3;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  NodeRef stack [244];
  
  stack[0] = root;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar91._4_4_ = fVar3;
  auVar91._0_4_ = fVar3;
  auVar91._8_4_ = fVar3;
  auVar91._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar93._4_4_ = fVar4;
  auVar93._0_4_ = fVar4;
  auVar93._8_4_ = fVar4;
  auVar93._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar92._4_4_ = fVar5;
  auVar92._0_4_ = fVar5;
  auVar92._8_4_ = fVar5;
  auVar92._12_4_ = fVar5;
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar29 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar56 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar73 = ZEXT416((uint)(fVar48 * 0.99999964));
  auVar73 = vshufps_avx(auVar73,auVar73,0);
  auVar74 = ZEXT416((uint)(fVar29 * 0.99999964));
  auVar74 = vshufps_avx(auVar74,auVar74,0);
  auVar66 = ZEXT416((uint)(fVar56 * 0.99999964));
  auVar66 = vshufps_avx(auVar66,auVar66,0);
  auVar30 = ZEXT416((uint)(fVar48 * 1.0000004));
  auVar30 = vshufps_avx(auVar30,auVar30,0);
  auVar31 = ZEXT416((uint)(fVar29 * 1.0000004));
  auVar31 = vshufps_avx(auVar31,auVar31,0);
  auVar32 = ZEXT416((uint)(fVar56 * 1.0000004));
  auVar32 = vshufps_avx(auVar32,auVar32,0);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar9 = (tray->tnear).field_0.i[k];
  auVar94._4_4_ = iVar9;
  auVar94._0_4_ = iVar9;
  auVar94._8_4_ = iVar9;
  auVar94._12_4_ = iVar9;
  iVar9 = (tray->tfar).field_0.i[k];
  auVar95._4_4_ = iVar9;
  auVar95._0_4_ = iVar9;
  auVar95._8_4_ = iVar9;
  auVar95._12_4_ = iVar9;
  pNVar24 = stack + 1;
  do {
    pNVar23 = pNVar24;
    if (pNVar23 == stack) break;
    pNVar24 = pNVar23 + -1;
    sVar22 = pNVar23[-1].ptr;
    do {
      if ((sVar22 & 8) == 0) {
        fVar48 = *(float *)(ray + k * 4 + 0x70);
        uVar17 = (uint)sVar22 & 7;
        uVar15 = sVar22 & 0xfffffffffffffff0;
        if (uVar17 == 3) {
          auVar33 = vshufps_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),0);
          fVar48 = 1.0 - fVar48;
          auVar34 = vshufps_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),0);
          fVar47 = auVar33._0_4_;
          fVar55 = auVar33._4_4_;
          fVar57 = auVar33._8_4_;
          fVar59 = auVar33._12_4_;
          auVar33 = vshufps_avx(ZEXT416((uint)(fVar48 * 0.0)),ZEXT416((uint)(fVar48 * 0.0)),0);
          fVar27 = auVar33._0_4_;
          fVar38 = auVar33._4_4_;
          fVar41 = auVar33._8_4_;
          fVar44 = auVar33._12_4_;
          fVar72 = auVar34._0_4_;
          auVar90._0_4_ = fVar72 + fVar47 * *(float *)(uVar15 + 0x110);
          fVar81 = auVar34._4_4_;
          auVar90._4_4_ = fVar81 + fVar55 * *(float *)(uVar15 + 0x114);
          fVar82 = auVar34._8_4_;
          auVar90._8_4_ = fVar82 + fVar57 * *(float *)(uVar15 + 0x118);
          fVar83 = auVar34._12_4_;
          auVar90._12_4_ = fVar83 + fVar59 * *(float *)(uVar15 + 0x11c);
          auVar34._0_4_ =
               *(float *)(uVar15 + 0x20) * fVar6 +
               *(float *)(uVar15 + 0x50) * fVar7 + *(float *)(uVar15 + 0x80) * fVar8;
          auVar34._4_4_ =
               *(float *)(uVar15 + 0x24) * fVar6 +
               *(float *)(uVar15 + 0x54) * fVar7 + *(float *)(uVar15 + 0x84) * fVar8;
          auVar34._8_4_ =
               *(float *)(uVar15 + 0x28) * fVar6 +
               *(float *)(uVar15 + 0x58) * fVar7 + *(float *)(uVar15 + 0x88) * fVar8;
          auVar34._12_4_ =
               *(float *)(uVar15 + 0x2c) * fVar6 +
               *(float *)(uVar15 + 0x5c) * fVar7 + *(float *)(uVar15 + 0x8c) * fVar8;
          auVar51._0_4_ =
               *(float *)(uVar15 + 0x30) * fVar6 +
               fVar7 * *(float *)(uVar15 + 0x60) + *(float *)(uVar15 + 0x90) * fVar8;
          auVar51._4_4_ =
               *(float *)(uVar15 + 0x34) * fVar6 +
               fVar7 * *(float *)(uVar15 + 100) + *(float *)(uVar15 + 0x94) * fVar8;
          auVar51._8_4_ =
               *(float *)(uVar15 + 0x38) * fVar6 +
               fVar7 * *(float *)(uVar15 + 0x68) + *(float *)(uVar15 + 0x98) * fVar8;
          auVar51._12_4_ =
               *(float *)(uVar15 + 0x3c) * fVar6 +
               fVar7 * *(float *)(uVar15 + 0x6c) + *(float *)(uVar15 + 0x9c) * fVar8;
          auVar77._0_4_ =
               fVar7 * *(float *)(uVar15 + 0x70) + fVar8 * *(float *)(uVar15 + 0xa0) +
               *(float *)(uVar15 + 0x40) * fVar6;
          auVar77._4_4_ =
               fVar7 * *(float *)(uVar15 + 0x74) + fVar8 * *(float *)(uVar15 + 0xa4) +
               *(float *)(uVar15 + 0x44) * fVar6;
          auVar77._8_4_ =
               fVar7 * *(float *)(uVar15 + 0x78) + fVar8 * *(float *)(uVar15 + 0xa8) +
               *(float *)(uVar15 + 0x48) * fVar6;
          auVar77._12_4_ =
               fVar7 * *(float *)(uVar15 + 0x7c) + fVar8 * *(float *)(uVar15 + 0xac) +
               *(float *)(uVar15 + 0x4c) * fVar6;
          auVar84._8_4_ = 0x7fffffff;
          auVar84._0_8_ = 0x7fffffff7fffffff;
          auVar84._12_4_ = 0x7fffffff;
          auVar33 = vandps_avx(auVar34,auVar84);
          auVar87._8_4_ = 0x219392ef;
          auVar87._0_8_ = 0x219392ef219392ef;
          auVar87._12_4_ = 0x219392ef;
          auVar33 = vcmpps_avx(auVar33,auVar87,1);
          auVar34 = vblendvps_avx(auVar34,auVar87,auVar33);
          auVar33 = vandps_avx(auVar51,auVar84);
          auVar33 = vcmpps_avx(auVar33,auVar87,1);
          auVar10 = vblendvps_avx(auVar51,auVar87,auVar33);
          auVar33 = vandps_avx(auVar77,auVar84);
          auVar33 = vcmpps_avx(auVar33,auVar87,1);
          auVar33 = vblendvps_avx(auVar77,auVar87,auVar33);
          auVar11 = vrcpps_avx(auVar34);
          fVar28 = auVar11._0_4_;
          auVar35._0_4_ = fVar28 * auVar34._0_4_;
          fVar39 = auVar11._4_4_;
          auVar35._4_4_ = fVar39 * auVar34._4_4_;
          fVar42 = auVar11._8_4_;
          auVar35._8_4_ = fVar42 * auVar34._8_4_;
          fVar45 = auVar11._12_4_;
          auVar35._12_4_ = fVar45 * auVar34._12_4_;
          auVar85._8_4_ = 0x3f800000;
          auVar85._0_8_ = &DAT_3f8000003f800000;
          auVar85._12_4_ = 0x3f800000;
          auVar34 = vsubps_avx(auVar85,auVar35);
          fVar28 = fVar28 + fVar28 * auVar34._0_4_;
          fVar39 = fVar39 + fVar39 * auVar34._4_4_;
          fVar42 = fVar42 + fVar42 * auVar34._8_4_;
          fVar45 = fVar45 + fVar45 * auVar34._12_4_;
          auVar34 = vrcpps_avx(auVar10);
          fVar48 = auVar34._0_4_;
          auVar52._0_4_ = auVar10._0_4_ * fVar48;
          fVar56 = auVar34._4_4_;
          auVar52._4_4_ = auVar10._4_4_ * fVar56;
          fVar58 = auVar34._8_4_;
          auVar52._8_4_ = auVar10._8_4_ * fVar58;
          fVar60 = auVar34._12_4_;
          auVar52._12_4_ = auVar10._12_4_ * fVar60;
          auVar34 = vsubps_avx(auVar85,auVar52);
          fVar48 = fVar48 + fVar48 * auVar34._0_4_;
          fVar56 = fVar56 + fVar56 * auVar34._4_4_;
          fVar58 = fVar58 + fVar58 * auVar34._8_4_;
          fVar60 = fVar60 + fVar60 * auVar34._12_4_;
          auVar34 = vrcpps_avx(auVar33);
          fVar29 = auVar34._0_4_;
          auVar78._0_4_ = auVar33._0_4_ * fVar29;
          fVar40 = auVar34._4_4_;
          auVar78._4_4_ = auVar33._4_4_ * fVar40;
          fVar43 = auVar34._8_4_;
          auVar78._8_4_ = auVar33._8_4_ * fVar43;
          fVar46 = auVar34._12_4_;
          auVar78._12_4_ = auVar33._12_4_ * fVar46;
          auVar33 = vsubps_avx(auVar85,auVar78);
          fVar29 = fVar29 + fVar29 * auVar33._0_4_;
          fVar40 = fVar40 + fVar40 * auVar33._4_4_;
          fVar43 = fVar43 + fVar43 * auVar33._8_4_;
          fVar46 = fVar46 + fVar46 * auVar33._12_4_;
          auVar79._0_4_ =
               fVar3 * *(float *)(uVar15 + 0x20) +
               fVar4 * *(float *)(uVar15 + 0x50) +
               *(float *)(uVar15 + 0x80) * fVar5 + *(float *)(uVar15 + 0xb0);
          auVar79._4_4_ =
               fVar3 * *(float *)(uVar15 + 0x24) +
               fVar4 * *(float *)(uVar15 + 0x54) +
               *(float *)(uVar15 + 0x84) * fVar5 + *(float *)(uVar15 + 0xb4);
          auVar79._8_4_ =
               fVar3 * *(float *)(uVar15 + 0x28) +
               fVar4 * *(float *)(uVar15 + 0x58) +
               *(float *)(uVar15 + 0x88) * fVar5 + *(float *)(uVar15 + 0xb8);
          auVar79._12_4_ =
               fVar3 * *(float *)(uVar15 + 0x2c) +
               fVar4 * *(float *)(uVar15 + 0x5c) +
               *(float *)(uVar15 + 0x8c) * fVar5 + *(float *)(uVar15 + 0xbc);
          auVar71._0_4_ =
               fVar3 * *(float *)(uVar15 + 0x30) +
               *(float *)(uVar15 + 0x90) * fVar5 + *(float *)(uVar15 + 0xc0) +
               fVar4 * *(float *)(uVar15 + 0x60);
          auVar71._4_4_ =
               fVar3 * *(float *)(uVar15 + 0x34) +
               *(float *)(uVar15 + 0x94) * fVar5 + *(float *)(uVar15 + 0xc4) +
               fVar4 * *(float *)(uVar15 + 100);
          auVar71._8_4_ =
               fVar3 * *(float *)(uVar15 + 0x38) +
               *(float *)(uVar15 + 0x98) * fVar5 + *(float *)(uVar15 + 200) +
               fVar4 * *(float *)(uVar15 + 0x68);
          auVar71._12_4_ =
               fVar3 * *(float *)(uVar15 + 0x3c) +
               *(float *)(uVar15 + 0x9c) * fVar5 + *(float *)(uVar15 + 0xcc) +
               fVar4 * *(float *)(uVar15 + 0x6c);
          auVar65._0_4_ =
               fVar3 * *(float *)(uVar15 + 0x40) +
               fVar4 * *(float *)(uVar15 + 0x70) +
               fVar5 * *(float *)(uVar15 + 0xa0) + *(float *)(uVar15 + 0xd0);
          auVar65._4_4_ =
               fVar3 * *(float *)(uVar15 + 0x44) +
               fVar4 * *(float *)(uVar15 + 0x74) +
               fVar5 * *(float *)(uVar15 + 0xa4) + *(float *)(uVar15 + 0xd4);
          auVar65._8_4_ =
               fVar3 * *(float *)(uVar15 + 0x48) +
               fVar4 * *(float *)(uVar15 + 0x78) +
               fVar5 * *(float *)(uVar15 + 0xa8) + *(float *)(uVar15 + 0xd8);
          auVar65._12_4_ =
               fVar3 * *(float *)(uVar15 + 0x4c) +
               fVar4 * *(float *)(uVar15 + 0x7c) +
               fVar5 * *(float *)(uVar15 + 0xac) + *(float *)(uVar15 + 0xdc);
          auVar33._4_4_ = fVar38 + fVar55 * *(float *)(uVar15 + 0xe4);
          auVar33._0_4_ = fVar27 + fVar47 * *(float *)(uVar15 + 0xe0);
          auVar33._8_4_ = fVar41 + fVar57 * *(float *)(uVar15 + 0xe8);
          auVar33._12_4_ = fVar44 + fVar59 * *(float *)(uVar15 + 0xec);
          auVar33 = vsubps_avx(auVar33,auVar79);
          auVar34 = vsubps_avx(auVar90,auVar79);
          auVar10._4_4_ = fVar38 + fVar55 * *(float *)(uVar15 + 0xf4);
          auVar10._0_4_ = fVar27 + fVar47 * *(float *)(uVar15 + 0xf0);
          auVar10._8_4_ = fVar41 + fVar57 * *(float *)(uVar15 + 0xf8);
          auVar10._12_4_ = fVar44 + fVar59 * *(float *)(uVar15 + 0xfc);
          auVar10 = vsubps_avx(auVar10,auVar71);
          auVar11._4_4_ = fVar55 * *(float *)(uVar15 + 0x124) + fVar81;
          auVar11._0_4_ = fVar47 * *(float *)(uVar15 + 0x120) + fVar72;
          auVar11._8_4_ = fVar57 * *(float *)(uVar15 + 0x128) + fVar82;
          auVar11._12_4_ = fVar59 * *(float *)(uVar15 + 300) + fVar83;
          auVar11 = vsubps_avx(auVar11,auVar71);
          auVar12._4_4_ = fVar55 * *(float *)(uVar15 + 0x104) + fVar38;
          auVar12._0_4_ = fVar47 * *(float *)(uVar15 + 0x100) + fVar27;
          auVar12._8_4_ = fVar57 * *(float *)(uVar15 + 0x108) + fVar41;
          auVar12._12_4_ = fVar59 * *(float *)(uVar15 + 0x10c) + fVar44;
          auVar12 = vsubps_avx(auVar12,auVar65);
          auVar13._4_4_ = fVar81 + fVar55 * *(float *)(uVar15 + 0x134);
          auVar13._0_4_ = fVar72 + fVar47 * *(float *)(uVar15 + 0x130);
          auVar13._8_4_ = fVar82 + fVar57 * *(float *)(uVar15 + 0x138);
          auVar13._12_4_ = fVar83 + fVar59 * *(float *)(uVar15 + 0x13c);
          auVar13 = vsubps_avx(auVar13,auVar65);
          auVar86._0_4_ = fVar28 * auVar33._0_4_;
          auVar86._4_4_ = fVar39 * auVar33._4_4_;
          auVar86._8_4_ = fVar42 * auVar33._8_4_;
          auVar86._12_4_ = fVar45 * auVar33._12_4_;
          auVar80._0_4_ = fVar28 * auVar34._0_4_;
          auVar80._4_4_ = fVar39 * auVar34._4_4_;
          auVar80._8_4_ = fVar42 * auVar34._8_4_;
          auVar80._12_4_ = fVar45 * auVar34._12_4_;
          auVar89._0_4_ = auVar10._0_4_ * fVar48;
          auVar89._4_4_ = auVar10._4_4_ * fVar56;
          auVar89._8_4_ = auVar10._8_4_ * fVar58;
          auVar89._12_4_ = auVar10._12_4_ * fVar60;
          auVar88._0_4_ = auVar12._0_4_ * fVar29;
          auVar88._4_4_ = auVar12._4_4_ * fVar40;
          auVar88._8_4_ = auVar12._8_4_ * fVar43;
          auVar88._12_4_ = auVar12._12_4_ * fVar46;
          auVar53._0_4_ = auVar11._0_4_ * fVar48;
          auVar53._4_4_ = auVar11._4_4_ * fVar56;
          auVar53._8_4_ = auVar11._8_4_ * fVar58;
          auVar53._12_4_ = auVar11._12_4_ * fVar60;
          auVar36._0_4_ = auVar13._0_4_ * fVar29;
          auVar36._4_4_ = auVar13._4_4_ * fVar40;
          auVar36._8_4_ = auVar13._8_4_ * fVar43;
          auVar36._12_4_ = auVar13._12_4_ * fVar46;
          auVar33 = vpminsd_avx(auVar89,auVar53);
          auVar34 = vpminsd_avx(auVar88,auVar36);
          auVar33 = vmaxps_avx(auVar33,auVar34);
          auVar12 = vpminsd_avx(auVar86,auVar80);
          auVar11 = vpmaxsd_avx(auVar86,auVar80);
          auVar34 = vpmaxsd_avx(auVar89,auVar53);
          auVar10 = vpmaxsd_avx(auVar88,auVar36);
          auVar10 = vminps_avx(auVar34,auVar10);
          auVar34 = vmaxps_avx(auVar94,auVar12);
          auVar33 = vmaxps_avx(auVar34,auVar33);
          auVar34 = vminps_avx(auVar95,auVar11);
          auVar34 = vminps_avx(auVar34,auVar10);
          auVar54._0_4_ = auVar33._0_4_ * 0.99999964;
          auVar54._4_4_ = auVar33._4_4_ * 0.99999964;
          auVar54._8_4_ = auVar33._8_4_ * 0.99999964;
          auVar54._12_4_ = auVar33._12_4_ * 0.99999964;
          auVar37._0_4_ = auVar34._0_4_ * 1.0000004;
          auVar37._4_4_ = auVar34._4_4_ * 1.0000004;
          auVar37._8_4_ = auVar34._8_4_ * 1.0000004;
          auVar37._12_4_ = auVar34._12_4_ * 1.0000004;
          auVar33 = vcmpps_avx(auVar54,auVar37,2);
        }
        else {
          auVar11 = vshufps_avx(ZEXT416((uint)fVar48),ZEXT416((uint)fVar48),0);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar25);
          fVar48 = auVar11._0_4_;
          fVar29 = auVar11._4_4_;
          fVar56 = auVar11._8_4_;
          fVar40 = auVar11._12_4_;
          pfVar1 = (float *)(uVar15 + 0x20 + uVar25);
          auVar49._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar49._4_4_ = fVar29 * pfVar2[1] + pfVar1[1];
          auVar49._8_4_ = fVar56 * pfVar2[2] + pfVar1[2];
          auVar49._12_4_ = fVar40 * pfVar2[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar49,auVar91);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar19);
          auVar50._0_4_ = auVar73._0_4_ * auVar33._0_4_;
          auVar50._4_4_ = auVar73._4_4_ * auVar33._4_4_;
          auVar50._8_4_ = auVar73._8_4_ * auVar33._8_4_;
          auVar50._12_4_ = auVar73._12_4_ * auVar33._12_4_;
          pfVar1 = (float *)(uVar15 + 0x20 + uVar19);
          auVar61._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar61._4_4_ = fVar29 * pfVar2[1] + pfVar1[1];
          auVar61._8_4_ = fVar56 * pfVar2[2] + pfVar1[2];
          auVar61._12_4_ = fVar40 * pfVar2[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar61,auVar93);
          pfVar2 = (float *)(uVar15 + 0x80 + uVar26);
          pfVar1 = (float *)(uVar15 + 0x20 + uVar26);
          auVar67._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar67._4_4_ = fVar29 * pfVar2[1] + pfVar1[1];
          auVar67._8_4_ = fVar56 * pfVar2[2] + pfVar1[2];
          auVar67._12_4_ = fVar40 * pfVar2[3] + pfVar1[3];
          auVar62._0_4_ = auVar74._0_4_ * auVar33._0_4_;
          auVar62._4_4_ = auVar74._4_4_ * auVar33._4_4_;
          auVar62._8_4_ = auVar74._8_4_ * auVar33._8_4_;
          auVar62._12_4_ = auVar74._12_4_ * auVar33._12_4_;
          auVar33 = vsubps_avx(auVar67,auVar92);
          auVar68._0_4_ = auVar66._0_4_ * auVar33._0_4_;
          auVar68._4_4_ = auVar66._4_4_ * auVar33._4_4_;
          auVar68._8_4_ = auVar66._8_4_ * auVar33._8_4_;
          auVar68._12_4_ = auVar66._12_4_ * auVar33._12_4_;
          auVar33 = vmaxps_avx(auVar62,auVar68);
          auVar34 = vmaxps_avx(auVar94,auVar50);
          auVar33 = vmaxps_avx(auVar34,auVar33);
          pfVar2 = (float *)(uVar15 + 0x80 + (uVar25 ^ 0x10));
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar25 ^ 0x10));
          auVar63._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar63._4_4_ = fVar29 * pfVar2[1] + pfVar1[1];
          auVar63._8_4_ = fVar56 * pfVar2[2] + pfVar1[2];
          auVar63._12_4_ = fVar40 * pfVar2[3] + pfVar1[3];
          auVar34 = vsubps_avx(auVar63,auVar91);
          auVar64._0_4_ = auVar30._0_4_ * auVar34._0_4_;
          auVar64._4_4_ = auVar30._4_4_ * auVar34._4_4_;
          auVar64._8_4_ = auVar30._8_4_ * auVar34._8_4_;
          auVar64._12_4_ = auVar30._12_4_ * auVar34._12_4_;
          pfVar2 = (float *)(uVar15 + 0x80 + (uVar19 ^ 0x10));
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar19 ^ 0x10));
          auVar69._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar69._4_4_ = fVar29 * pfVar2[1] + pfVar1[1];
          auVar69._8_4_ = fVar56 * pfVar2[2] + pfVar1[2];
          auVar69._12_4_ = fVar40 * pfVar2[3] + pfVar1[3];
          auVar34 = vsubps_avx(auVar69,auVar93);
          auVar70._0_4_ = auVar31._0_4_ * auVar34._0_4_;
          auVar70._4_4_ = auVar31._4_4_ * auVar34._4_4_;
          auVar70._8_4_ = auVar31._8_4_ * auVar34._8_4_;
          auVar70._12_4_ = auVar31._12_4_ * auVar34._12_4_;
          pfVar2 = (float *)(uVar15 + 0x80 + (uVar26 ^ 0x10));
          pfVar1 = (float *)(uVar15 + 0x20 + (uVar26 ^ 0x10));
          auVar75._0_4_ = fVar48 * *pfVar2 + *pfVar1;
          auVar75._4_4_ = fVar29 * pfVar2[1] + pfVar1[1];
          auVar75._8_4_ = fVar56 * pfVar2[2] + pfVar1[2];
          auVar75._12_4_ = fVar40 * pfVar2[3] + pfVar1[3];
          auVar34 = vsubps_avx(auVar75,auVar92);
          auVar76._0_4_ = auVar32._0_4_ * auVar34._0_4_;
          auVar76._4_4_ = auVar32._4_4_ * auVar34._4_4_;
          auVar76._8_4_ = auVar32._8_4_ * auVar34._8_4_;
          auVar76._12_4_ = auVar32._12_4_ * auVar34._12_4_;
          auVar34 = vminps_avx(auVar70,auVar76);
          auVar10 = vminps_avx(auVar95,auVar64);
          auVar34 = vminps_avx(auVar10,auVar34);
          if (uVar17 == 6) {
            auVar34 = vcmpps_avx(auVar33,auVar34,2);
            auVar33 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0xe0),auVar11,2);
            auVar10 = vcmpps_avx(auVar11,*(undefined1 (*) [16])(uVar15 + 0xf0),1);
            auVar33 = vandps_avx(auVar33,auVar10);
            auVar33 = vandps_avx(auVar33,auVar34);
          }
          else {
            auVar33 = vcmpps_avx(auVar33,auVar34,2);
          }
          auVar33 = vpslld_avx(auVar33,0x1f);
        }
        uVar20 = vmovmskps_avx(auVar33);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar20);
      }
      if ((sVar22 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar17 = 4;
        }
        else {
          uVar15 = sVar22 & 0xfffffffffffffff0;
          lVar18 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
            }
          }
          uVar17 = 0;
          sVar22 = *(size_t *)(uVar15 + lVar18 * 8);
          uVar21 = unaff_RBP - 1 & unaff_RBP;
          if (uVar21 != 0) {
            pNVar24->ptr = sVar22;
            lVar18 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
              }
            }
            uVar16 = uVar21 - 1;
            while( true ) {
              pNVar24 = pNVar24 + 1;
              sVar22 = *(size_t *)(uVar15 + lVar18 * 8);
              uVar16 = uVar16 & uVar21;
              if (uVar16 == 0) break;
              pNVar24->ptr = sVar22;
              lVar18 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                }
              }
              uVar21 = uVar16 - 1;
            }
          }
        }
      }
      else {
        uVar17 = 6;
      }
    } while (uVar17 == 0);
    if (uVar17 == 6) {
      cVar14 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar22 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar17 = 0;
      if (cVar14 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar17 = 1;
      }
    }
  } while ((uVar17 & 3) == 0);
  return pNVar23 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }